

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O2

int __thiscall
ncnn::PriorBox::forward
          (PriorBox *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  pointer pMVar4;
  Mat *this_00;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [16];
  float *pfVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int p;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 in_XMM4 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar13 = this->image_width;
  iVar19 = this->image_height;
  if (iVar13 == -0xe9) {
    iVar13 = pMVar4[1].w;
  }
  iVar15 = pMVar4->w;
  uVar1 = pMVar4->h;
  if (iVar19 == -0xe9) {
    iVar19 = pMVar4[1].h;
  }
  fVar23 = this->step_height;
  fVar22 = (float)iVar13;
  fVar24 = (float)iVar19;
  auVar25._8_8_ = CONCAT44(fVar24,fVar22);
  auVar25._0_8_ = CONCAT44(fVar24,fVar22);
  auVar25 = rcpps(in_XMM4,auVar25);
  fVar26 = auVar25._0_4_;
  fVar28 = auVar25._4_4_;
  fVar29 = auVar25._8_4_;
  fVar30 = auVar25._12_4_;
  fVar26 = (1.0 - fVar22 * fVar26) * fVar26 + fVar26;
  fVar28 = (1.0 - fVar24 * fVar28) * fVar28 + fVar28;
  fVar29 = (1.0 - fVar22 * fVar29) * fVar29 + fVar29;
  fVar30 = (1.0 - fVar24 * fVar30) * fVar30 + fVar30;
  uVar20 = -(uint)(this->step_width == -233.0);
  fVar22 = (float)(~uVar20 & (uint)this->step_width | (uint)(fVar22 / (float)iVar15) & uVar20);
  uVar21 = -(uint)(fVar23 == -233.0);
  uVar20 = (this->min_sizes).w;
  iVar13 = (this->max_sizes).w;
  uVar2 = (this->aspect_ratios).w;
  iVar19 = this->flip;
  if (this->flip != 0) {
    iVar19 = uVar2 * uVar20;
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar19 = (uVar2 * uVar20 + iVar13 + uVar20 + iVar19) * iVar15;
  Mat::create(this_00,iVar19 * uVar1 * 4,2,4,opt->blob_allocator);
  uVar8 = 0;
  uVar14 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar14 = uVar8;
  }
  uVar18 = (ulong)uVar20;
  if ((int)uVar20 < 1) {
    uVar18 = uVar8;
  }
  if (iVar15 < 1) {
    iVar15 = 0;
  }
  uVar9 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar9 = uVar8;
  }
  for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    pauVar10 = (undefined1 (*) [16])((long)(iVar19 * 4 * (int)uVar8) * 4 + (long)this_00->data);
    fVar31 = this->offset * fVar22;
    fVar27 = ((float)(int)uVar8 + this->offset) *
             (float)(~uVar21 & (uint)fVar23 | (uint)(fVar24 / (float)(int)uVar1) & uVar21);
    for (iVar12 = 0; iVar12 != iVar15; iVar12 = iVar12 + 1) {
      pvVar5 = (this->min_sizes).data;
      pvVar6 = (this->max_sizes).data;
      for (uVar16 = 0; uVar16 != uVar18; uVar16 = uVar16 + 1) {
        fVar33 = *(float *)((long)pvVar5 + uVar16 * 4);
        fVar32 = fVar33 * 0.5;
        auVar35._0_4_ = (fVar31 - fVar32) * fVar26;
        auVar35._4_4_ = (fVar27 - fVar32) * fVar28;
        auVar35._8_4_ = (fVar32 + fVar31) * fVar29;
        auVar35._12_4_ = (fVar32 + fVar27) * fVar30;
        *pauVar10 = auVar35;
        if (iVar13 < 1) {
          pauVar10 = pauVar10 + 1;
        }
        else {
          fVar33 = SQRT(fVar33 * *(float *)((long)pvVar6 + uVar16 * 4)) * 0.5;
          auVar35._0_4_ = fVar31 - fVar33;
          auVar35._4_4_ = fVar27 - fVar33;
          auVar35._8_4_ = fVar31 - fVar33;
          auVar35._12_4_ = fVar27 - fVar33;
          *(float *)pauVar10[1] = auVar35._0_4_ * fVar26;
          *(float *)(pauVar10[1] + 4) = auVar35._4_4_ * fVar28;
          *(float *)(pauVar10[1] + 8) = (fVar33 + fVar31) * fVar29;
          *(float *)(pauVar10[1] + 0xc) = (fVar33 + fVar27) * fVar30;
          pauVar10 = pauVar10 + 2;
        }
        pvVar7 = (this->aspect_ratios).data;
        iVar3 = this->flip;
        for (uVar17 = 0; uVar14 != uVar17; uVar17 = uVar17 + 1) {
          fVar33 = *(float *)((long)pvVar7 + uVar17 * 4);
          auVar25 = rsqrtss(auVar35,ZEXT416((uint)fVar33));
          fVar34 = auVar25._0_4_;
          fVar37 = fVar33 * fVar34 * fVar34 + -3.0;
          auVar35._4_12_ = auVar25._4_12_;
          fVar33 = (float)(~-(uint)(ABS(fVar33) < 1.1754944e-38) &
                          (uint)(fVar33 * fVar34 * -0.5 * fVar37)) * fVar32;
          auVar35._0_4_ = fVar34 * -0.5 * fVar32 * fVar37;
          *(float *)*pauVar10 = (fVar31 - fVar33) * fVar26;
          *(float *)((long)*pauVar10 + 4) = (fVar27 - auVar35._0_4_) * fVar28;
          *(float *)((long)*pauVar10 + 8) = (fVar31 + fVar33) * fVar29;
          *(float *)((long)*pauVar10 + 0xc) = (fVar27 + auVar35._0_4_) * fVar30;
          if (iVar3 == 0) {
            pauVar10 = pauVar10 + 1;
          }
          else {
            auVar36._0_4_ = fVar31 + auVar35._0_4_;
            auVar36._4_4_ = fVar27 + fVar33;
            auVar36._8_4_ = auVar35._0_4_ + fVar31;
            auVar36._12_4_ = fVar33 + fVar27;
            *(float *)pauVar10[1] = (fVar31 - auVar35._0_4_) * fVar26;
            *(float *)(pauVar10[1] + 4) = (fVar27 - fVar33) * fVar28;
            *(float *)(pauVar10[1] + 8) = auVar36._0_4_ * fVar29;
            *(float *)(pauVar10[1] + 0xc) = auVar36._4_4_ * fVar30;
            pauVar10 = pauVar10 + 2;
            auVar35 = auVar36;
          }
        }
      }
      fVar31 = fVar31 + fVar22;
    }
  }
  pvVar5 = this_00->data;
  uVar1 = this_00->w;
  if (this->clip != 0) {
    uVar14 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    for (; uVar8 != uVar14; uVar14 = uVar14 + 1) {
      fVar23 = *(float *)((long)pvVar5 + uVar14 * 4);
      if (fVar23 <= 0.0) {
        fVar23 = 0.0;
      }
      if (1.0 <= fVar23) {
        fVar23 = 1.0;
      }
      *(float *)((long)pvVar5 + uVar14 * 4) = fVar23;
    }
  }
  pfVar11 = (float *)((long)pvVar5 + (long)(int)uVar1 * 4);
  uVar14 = 0;
  if (0 < (int)((long)(int)uVar1 / 4)) {
    uVar14 = (long)(int)uVar1 / 4 & 0xffffffff;
  }
  while (iVar13 = (int)uVar14, uVar14 = (ulong)(iVar13 - 1), iVar13 != 0) {
    *pfVar11 = this->variances[0];
    pfVar11[1] = this->variances[1];
    pfVar11[2] = this->variances[2];
    pfVar11[3] = this->variances[3];
    pfVar11 = pfVar11 + 4;
  }
  return 0;
}

Assistant:

int PriorBox::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int w = bottom_blobs[0].w;
    int h = bottom_blobs[0].h;

    int image_w = image_width;
    int image_h = image_height;
    if (image_w == -233)
        image_w = bottom_blobs[1].w;
    if (image_h == -233)
        image_h = bottom_blobs[1].h;

    float step_w = step_width;
    float step_h = step_height;
    if (step_w == -233)
        step_w = (float)image_w / w;
    if (step_h == -233)
        step_h = (float)image_h / h;

    int num_min_size = min_sizes.w;
    int num_max_size = max_sizes.w;
    int num_aspect_ratio = aspect_ratios.w;

    int num_prior = num_min_size * num_aspect_ratio + num_min_size + num_max_size;
    if (flip)
        num_prior += num_min_size * num_aspect_ratio;

    Mat& top_blob = top_blobs[0];
    top_blob.create(4 * w * h * num_prior, 2, 4u, opt.blob_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < h; i++)
    {
        float* box = (float*)top_blob + i * w * num_prior * 4;

        float center_x = offset * step_w;
        float center_y = offset * step_h + i * step_h;

        for (int j = 0; j < w; j++)
        {
            float box_w;
            float box_h;

            for (int k = 0; k < num_min_size; k++)
            {
                float min_size = min_sizes[k];

                // min size box
                box_w = box_h = min_size;

                box[0] = (center_x - box_w * 0.5f) / image_w;
                box[1] = (center_y - box_h * 0.5f) / image_h;
                box[2] = (center_x + box_w * 0.5f) / image_w;
                box[3] = (center_y + box_h * 0.5f) / image_h;

                box += 4;

                if (num_max_size > 0)
                {
                    float max_size = max_sizes[k];

                    // max size box
                    box_w = box_h = sqrt(min_size * max_size);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;
                }

                // all aspect_ratios
                for (int p = 0; p < num_aspect_ratio; p++)
                {
                    float ar = aspect_ratios[p];

                    box_w = min_size * sqrt(ar);
                    box_h = min_size / sqrt(ar);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;

                    if (flip)
                    {
                        box[0] = (center_x - box_h * 0.5f) / image_w;
                        box[1] = (center_y - box_w * 0.5f) / image_h;
                        box[2] = (center_x + box_h * 0.5f) / image_w;
                        box[3] = (center_y + box_w * 0.5f) / image_h;

                        box += 4;
                    }
                }
            }

            center_x += step_w;
        }

        center_y += step_h;
    }

    if (clip)
    {
        float* box = top_blob;
        for (int i = 0; i < top_blob.w; i++)
        {
            box[i] = std::min(std::max(box[i], 0.f), 1.f);
        }
    }

    // set variance
    float* var = top_blob.row(1);
    for (int i = 0; i < top_blob.w / 4; i++)
    {
        var[0] = variances[0];
        var[1] = variances[1];
        var[2] = variances[2];
        var[3] = variances[3];

        var += 4;
    }

    return 0;
}